

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::blendFuncSeparate
          (ReferenceContext *this,deUint32 srcRGB,deUint32 dstRGB,deUint32 srcAlpha,
          deUint32 dstAlpha)

{
  bool bVar1;
  deBool dVar2;
  deUint32 dstAlpha_local;
  deUint32 srcAlpha_local;
  deUint32 dstRGB_local;
  deUint32 srcRGB_local;
  ReferenceContext *this_local;
  
  while ((((bVar1 = isValidBlendFactor(srcRGB), bVar1 && (bVar1 = isValidBlendFactor(dstRGB), bVar1)
           ) && (bVar1 = isValidBlendFactor(srcAlpha), bVar1)) &&
         (bVar1 = isValidBlendFactor(dstAlpha), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      this->m_blendFactorSrcRGB = srcRGB;
      this->m_blendFactorSrcAlpha = srcAlpha;
      this->m_blendFactorDstRGB = dstRGB;
      this->m_blendFactorDstAlpha = dstAlpha;
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::blendFuncSeparate (deUint32 srcRGB, deUint32 dstRGB, deUint32 srcAlpha, deUint32 dstAlpha)
{
	RC_IF_ERROR(!isValidBlendFactor(srcRGB)		||
				!isValidBlendFactor(dstRGB)		||
				!isValidBlendFactor(srcAlpha)	||
				!isValidBlendFactor(dstAlpha),
				GL_INVALID_ENUM, RC_RET_VOID);

	m_blendFactorSrcRGB		= srcRGB;
	m_blendFactorSrcAlpha	= srcAlpha;
	m_blendFactorDstRGB		= dstRGB;
	m_blendFactorDstAlpha	= dstAlpha;
}